

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astmem.cpp
# Opt level: O2

int main(int argc,char **argsv)

{
  int iVar1;
  ostream *poVar2;
  LanguageConfiguration cfg;
  undefined1 local_318 [8];
  Logger log;
  Parser parser;
  string local_298 [32];
  Lexer lex;
  istringstream input;
  
  iVar1 = 1;
  if ((argc == 2) && (*argsv[1] != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lex,argsv[1],(allocator<char> *)&parser);
    std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&lex,_S_in);
    std::__cxx11::string::~string((string *)&lex);
    cfg.multiLineString = false;
    cfg.multiLineStringLeftTrim = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser,"<args[1]>",(allocator<char> *)&log);
    pfederc::Lexer::Lexer(&lex,&cfg,(istream *)&input,(string *)&parser);
    std::__cxx11::string::~string((string *)&parser);
    pfederc::BaseLogger::BaseLogger
              ((BaseLogger *)&parser,(ostream *)&std::cout,(ostream *)&std::cerr);
    pfederc::Logger::Logger
              (&log,LVL_FAILURE|LVL_FATAL|LVL_HELP|LVL_NOTE|LVL_ERROR|LVL_WARNING,
               (BaseLogger *)&parser);
    pfederc::BaseLogger::~BaseLogger((BaseLogger *)&parser);
    pfederc::Lexer::next(&lex);
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header;
    parser.errors.
    super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parser.errors.
    super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parser.errors.
    super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parser.descriptions._M_t._M_impl._0_8_ = 0;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parser.lexer = &lex;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pfederc::Parser::parseExpression((Parser *)local_318,(Precedence)&parser);
    pfederc::logLexerErrors(&log,&lex);
    if (local_318 == (undefined1  [8])0x0) {
      pfederc::logParserErrors(&log,&parser);
    }
    else {
      (*(*(_func_int ***)local_318)[2])(local_298);
      poVar2 = std::operator<<((ostream *)&std::cout,local_298);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_298);
    }
    if (local_318 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_318)[1])();
    }
    pfederc::Parser::~Parser(&parser);
    pfederc::Logger::~Logger(&log);
    pfederc::Lexer::~Lexer(&lex);
    std::__cxx11::istringstream::~istringstream((istringstream *)&input);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char * argsv[]) {
  if (argc != 2 || strlen(argsv[1]) == 0)
    return 1;

  std::istringstream input(argsv[1]);
  LanguageConfiguration cfg = createDefaultLanguageConfiguration();
  Lexer lex(cfg, input, "<args[1]>");

  Logger log;
  
  lex.next();
  Parser parser(lex);
  auto expr = parser.parseExpression();

  logLexerErrors(log, lex);

  if (!expr) {
    logParserErrors(log, parser);
    return 0;
  }

  std::cout << expr->toString() << std::endl;

  return 0;
}